

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transfer_Control_Request_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Transfer_Control_Request_PDU::SetRecordSets
          (Transfer_Control_Request_PDU *this,
          vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_> *RS)

{
  KUINT16 *pKVar1;
  pointer pRVar2;
  pointer pRVar3;
  RecordSet *pRVar4;
  KUINT16 KVar5;
  pointer pRVar6;
  RecordSet *this_00;
  
  pRVar2 = (this->m_vRecs).
           super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar3 = (this->m_vRecs).
           super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pRVar6 = pRVar2;
  if (pRVar3 != pRVar2) {
    do {
      (**(pRVar6->super_DataTypeBase)._vptr_DataTypeBase)(pRVar6);
      pRVar6 = pRVar6 + 1;
    } while (pRVar6 != pRVar3);
    (this->m_vRecs).
    super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>.
    _M_impl.super__Vector_impl_data._M_finish = pRVar2;
  }
  std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::operator=
            (&this->m_vRecs,RS);
  this_00 = (this->m_vRecs).
            super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pRVar4 = (this->m_vRecs).
           super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this->m_ui32NumRecSets = (int)((ulong)((long)pRVar4 - (long)this_00) >> 4) * -0x55555555;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength = 0x28;
  for (; pRVar4 != this_00; this_00 = this_00 + 1) {
    KVar5 = DATA_TYPE::RecordSet::GetRecordLength(this_00);
    pKVar1 = &(this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + KVar5;
  }
  return;
}

Assistant:

void Transfer_Control_Request_PDU::SetRecordSets( const vector<RecordSet> & RS )
{
    m_vRecs.clear();
    m_vRecs = RS;
    m_ui32NumRecSets = m_vRecs.size();

    // Calculate the PDU size
    m_ui16PDULength = TRANSFER_CONTROL_REQUEST_PDU_SIZE;

    vector<RecordSet>::const_iterator citr = m_vRecs.begin();
    vector<RecordSet>::const_iterator citrEnd = m_vRecs.end();

    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength += citr->GetRecordLength();
    }
}